

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcheckbox.cpp
# Opt level: O1

void QCheckBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  int iVar2;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      local_3c = *_a[1];
      iVar2 = 1;
LAB_003d807b:
      puStack_30 = &local_3c;
      local_38 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar2,&local_38);
    }
    else if (_id == 0) {
      local_3c = *_a[1];
      iVar2 = 0;
      goto LAB_003d807b;
    }
    if (_c != ReadProperty) {
      if (_c != WriteProperty) {
        if (_c != IndexOfMethod) goto switchD_003d8004_caseD_3;
        goto switchD_003d8004_caseD_5;
      }
      goto switchD_003d8004_caseD_2;
    }
    break;
  case ReadProperty:
    break;
  case WriteProperty:
switchD_003d8004_caseD_2:
    if (_id != 0) goto switchD_003d8004_caseD_3;
    goto LAB_003d8105;
  default:
    goto switchD_003d8004_caseD_3;
  case IndexOfMethod:
switchD_003d8004_caseD_5:
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == stateChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003d8004_caseD_3;
    }
    if (((code *)*plVar1 == checkStateChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003d8004_caseD_3;
    }
    if (_c == WriteProperty) goto switchD_003d8004_caseD_2;
    if (_c != ReadProperty) goto switchD_003d8004_caseD_3;
  }
  if (_id == 0) {
    *(byte *)*_a = *(byte *)(*(long *)(_o + 8) + 0x2b4) & 1;
  }
  if (_c == WriteProperty && _id == 0) {
LAB_003d8105:
    *(byte *)(*(long *)(_o + 8) + 0x2b4) = *(byte *)(*(long *)(_o + 8) + 0x2b4) & 0xfe | **_a;
  }
switchD_003d8004_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCheckBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCheckBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->checkStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::CheckState>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(int )>(_a, &QCheckBox::stateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(Qt::CheckState )>(_a, &QCheckBox::checkStateChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTristate(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTristate(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}